

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::PopOneElement
          (ProtoStreamObjectWriter *this)

{
  Item *pIVar1;
  Item *pIVar2;
  
  if (((this->current_)._M_t.
       super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
       .
       super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
      ._M_head_impl)->is_list_ == true) {
    ProtoWriter::EndList(&this->super_ProtoWriter);
  }
  else {
    ProtoWriter::EndObject(&this->super_ProtoWriter);
  }
  pIVar2 = StructuredObjectWriter::BaseElement::
           pop<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>
                     (&((this->current_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
                        .
                        super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
                       ._M_head_impl)->super_BaseElement);
  pIVar1 = (this->current_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
           ._M_head_impl;
  (this->current_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>.
  _M_head_impl = pIVar2;
  if (pIVar1 != (Item *)0x0) {
    (**(code **)((long)(pIVar1->super_BaseElement)._vptr_BaseElement + 8))();
    return;
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::PopOneElement() {
  current_->is_list() ? ProtoWriter::EndList() : ProtoWriter::EndObject();
  current_.reset(current_->pop<Item>());
}